

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ply.cc
# Opt level: O0

PLYProperty * gvr::anon_unknown_3::PLYProperty::fromString(string *s,ply_encoding encoding)

{
  int iVar1;
  ply_type t_size;
  reference pvVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__rhs;
  size_type sVar3;
  PLYProperty *pPVar4;
  undefined8 uVar5;
  string *in_RSI;
  PLYProperty *in_RDI;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  list;
  string *in_stack_ffffffffffffff08;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_ffffffffffffff20;
  ply_encoding encoding_00;
  ply_encoding in_stack_ffffffffffffff30;
  ply_type in_stack_ffffffffffffff34;
  string *in_stack_ffffffffffffff38;
  string *propname;
  PLYProperty *in_stack_ffffffffffffff40;
  undefined4 in_stack_ffffffffffffff48;
  undefined4 in_stack_ffffffffffffff4c;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff50;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_30;
  string *local_10;
  
  pPVar4 = in_RDI;
  local_10 = in_RSI;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)0x123b0d);
  gutil::split((vector *)&local_30,local_10,' ',true);
  pvVar2 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::operator[](&local_30,0);
  iVar1 = std::__cxx11::string::compare((char *)pvVar2);
  if (iVar1 != 0) {
    __rhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
            __cxa_allocate_exception(0x28);
    std::operator+((char *)pPVar4,__rhs);
    gutil::IOException::IOException
              ((IOException *)__rhs,
               (string *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
    __cxa_throw(__rhs,&gutil::IOException::typeinfo,gutil::IOException::~IOException);
  }
  sVar3 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size(&local_30);
  if (sVar3 == 3) {
    propname = (string *)&local_30;
    pPVar4 = (PLYProperty *)
             std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)propname,2);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)propname,1);
    name2Type(in_stack_ffffffffffffff08);
    PLYProperty(pPVar4,propname,in_stack_ffffffffffffff34,in_stack_ffffffffffffff30);
LAB_00123e18:
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(in_stack_ffffffffffffff20);
    return in_RDI;
  }
  sVar3 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size(&local_30);
  if (sVar3 == 5) {
    pvVar2 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[](&local_30,1);
    iVar1 = std::__cxx11::string::compare((char *)pvVar2);
    if (iVar1 == 0) {
      in_stack_ffffffffffffff20 = &local_30;
      pvVar2 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[](in_stack_ffffffffffffff20,4);
      encoding_00 = (ply_encoding)((ulong)pvVar2 >> 0x20);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator[](in_stack_ffffffffffffff20,2);
      t_size = name2Type(in_stack_ffffffffffffff08);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator[](&local_30,3);
      name2Type(in_stack_ffffffffffffff08);
      PLYProperty(in_stack_ffffffffffffff40,in_stack_ffffffffffffff38,t_size,
                  in_stack_ffffffffffffff30,encoding_00);
      goto LAB_00123e18;
    }
  }
  uVar5 = __cxa_allocate_exception(0x28);
  std::operator+((char *)pPVar4,in_stack_ffffffffffffff50);
  gutil::IOException::IOException
            ((IOException *)in_stack_ffffffffffffff50,
             (string *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48));
  __cxa_throw(uVar5,&gutil::IOException::typeinfo,gutil::IOException::~IOException);
}

Assistant:

PLYProperty PLYProperty::fromString(const std::string &s, ply_encoding encoding)
{
  std::vector<std::string> list;

  gutil::split(list, s);

  if (list[0].compare("property") != 0)
  {
    throw gutil::IOException("Invalid PLY property definition: "+s);
  }

  if (list.size() == 3)
  {
    return PLYProperty(list[2], name2Type(list[1]), encoding);
  }
  else if (list.size() == 5 && list[1].compare("list") == 0)
  {
    return PLYProperty(list[4], name2Type(list[2]), name2Type(list[3]), encoding);
  }
  else
  {
    throw gutil::IOException("Invalid PLY property definition: "+s);
  }
}